

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

Graph<Node> * __thiscall
Graph<Node>::minSpanningTree(Graph<Node> *__return_storage_ptr__,Graph<Node> *this,int node)

{
  Edge *__last;
  NodeList<Node> *pNVar1;
  int iVar2;
  int iVar3;
  Edge *pEVar4;
  Node *pNVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *__s;
  int *__s_00;
  undefined8 *puVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t __size;
  size_t __size_00;
  Graph<Node> *pGVar13;
  long lVar14;
  Graph<Node> *MST;
  vector<Edge> ccEdges;
  int dest;
  int source;
  vector<int> father;
  vector<int> depth;
  vector<Edge> local_78;
  Graph<Node> *local_68;
  int local_60;
  int local_5c;
  vector<int> local_58;
  vector<int> local_48;
  vector<Edge> *local_38;
  
  iVar2 = this->_nodeCnt;
  iVar3 = 1;
  do {
    iVar6 = iVar3;
    iVar3 = iVar6 * 2;
  } while (iVar6 < iVar2);
  uVar11 = 0xffffffffffffffff;
  if (-1 < iVar6) {
    uVar11 = (long)iVar6 << 2;
  }
  local_68 = this;
  local_58._size = iVar2;
  __s = (int *)operator_new__(uVar11);
  memset(__s,0,uVar11);
  iVar3 = 1;
  do {
    iVar7 = iVar3;
    iVar3 = iVar7 * 2;
  } while (iVar7 < iVar2);
  uVar11 = 0xffffffffffffffff;
  if (-1 < iVar7) {
    uVar11 = (long)iVar7 << 2;
  }
  local_58.vect = __s;
  local_58._capacity = iVar6;
  local_48._size = iVar2;
  __s_00 = (int *)operator_new__(uVar11);
  memset(__s_00,0,uVar11);
  pGVar13 = local_68;
  iVar2 = local_68->_nodeCnt;
  if (0 < (long)iVar2) {
    lVar12 = 0;
    do {
      __s[lVar12] = (int)lVar12;
      __s_00[lVar12] = 1;
      lVar12 = lVar12 + 1;
    } while (iVar2 != lVar12);
  }
  iVar2 = (local_68->inCC).vect[node];
  local_48.vect = __s_00;
  local_48._capacity = iVar7;
  puVar9 = (undefined8 *)operator_new__(0x14);
  *puVar9 = 1;
  local_78.vect = (Edge *)(puVar9 + 1);
  puVar9[1] = 0;
  *(undefined4 *)(puVar9 + 2) = 0;
  local_78._size = 0;
  local_78._capacity = 1;
  if (0 < (pGVar13->edges)._size) {
    lVar14 = 8;
    lVar12 = 0;
    __size = extraout_RDX;
    do {
      pEVar4 = (pGVar13->edges).vect;
      iVar3 = *(int *)((long)pEVar4 + lVar14 + -8);
      if ((pGVar13->inCC).vect[iVar3] == iVar2) {
        iVar6 = *(int *)((long)pEVar4 + lVar14 + -4);
        iVar7 = *(int *)((long)&pEVar4->_nodeS + lVar14);
        if (local_78._capacity <= local_78._size) {
          vector<Edge>::realloc(&local_78,(void *)(ulong)(uint)(local_78._capacity * 2),__size);
          __size = extraout_RDX_00;
        }
        lVar10 = (long)local_78._size;
        local_78._size = local_78._size + 1;
        local_78.vect[lVar10]._nodeS = iVar3;
        local_78.vect[lVar10]._nodeD = iVar6;
        local_78.vect[lVar10]._cost = iVar7;
        pGVar13 = local_68;
      }
      lVar12 = lVar12 + 1;
      lVar14 = lVar14 + 0xc;
    } while (lVar12 < (pGVar13->edges)._size);
  }
  pEVar4 = local_78.vect;
  uVar11 = (ulong)local_78._size;
  if (uVar11 != 0) {
    __last = local_78.vect + uVar11;
    lVar12 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<Edge*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Edge_const&,Edge_const&)>>
              (local_78.vect,__last,(ulong)(((uint)lVar12 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_Edge_&,_const_Edge_&)>)0x103e26);
    std::
    __final_insertion_sort<Edge*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Edge_const&,Edge_const&)>>
              (pEVar4,__last,(_Iter_comp_iter<bool_(*)(const_Edge_&,_const_Edge_&)>)0x103e26);
  }
  Graph(__return_storage_ptr__,pGVar13->_nodeCnt);
  if (0 < local_78._size) {
    local_38 = &__return_storage_ptr__->edges;
    lVar14 = 8;
    lVar12 = 0;
    do {
      iVar2 = *(int *)((long)local_78.vect + lVar14 + -8);
      iVar3 = *(int *)((long)local_78.vect + lVar14 + -4);
      iVar6 = *(int *)((long)&(local_78.vect)->_nodeS + lVar14);
      local_60 = iVar3;
      local_5c = iVar2;
      iVar7 = findRt(local_68,&local_58,&local_5c);
      iVar8 = findRt(local_68,&local_58,&local_60);
      if (iVar7 != iVar8) {
        mergeDSU(local_68,&local_58,&local_48,local_5c,local_60);
        __return_storage_ptr__->_edgeCnt = __return_storage_ptr__->_edgeCnt + 1;
        iVar7 = (__return_storage_ptr__->edges)._capacity;
        if (iVar7 <= (__return_storage_ptr__->edges)._size) {
          vector<Edge>::realloc(local_38,(void *)(ulong)(uint)(iVar7 * 2),__size_00);
        }
        iVar7 = (__return_storage_ptr__->edges)._size;
        (__return_storage_ptr__->edges)._size = iVar7 + 1;
        pEVar4 = (__return_storage_ptr__->edges).vect;
        pEVar4[iVar7]._nodeS = iVar2;
        pEVar4[iVar7]._nodeD = iVar3;
        pEVar4[iVar7]._cost = iVar6;
        pNVar1 = (__return_storage_ptr__->G).vect + iVar2;
        iVar7 = (pNVar1->nodes)._capacity;
        if (iVar7 <= (pNVar1->nodes)._size) {
          vector<Node>::realloc(&pNVar1->nodes,(void *)(ulong)(uint)(iVar7 * 2),(size_t)pEVar4);
        }
        iVar7 = (pNVar1->nodes)._size;
        (pNVar1->nodes)._size = iVar7 + 1;
        pNVar5 = (pNVar1->nodes).vect;
        pNVar5[iVar7]._index = iVar3;
        pNVar5[iVar7]._costTo = iVar6;
        pNVar1 = (__return_storage_ptr__->G).vect + iVar3;
        iVar3 = (pNVar1->nodes)._capacity;
        if (iVar3 <= (pNVar1->nodes)._size) {
          vector<Node>::realloc(&pNVar1->nodes,(void *)(ulong)(uint)(iVar3 * 2),(size_t)pNVar5);
        }
        iVar3 = (pNVar1->nodes)._size;
        (pNVar1->nodes)._size = iVar3 + 1;
        pNVar5 = (pNVar1->nodes).vect;
        pNVar5[iVar3]._index = iVar2;
        pNVar5[iVar3]._costTo = iVar6;
      }
      lVar12 = lVar12 + 1;
      lVar14 = lVar14 + 0xc;
    } while (lVar12 < local_78._size);
  }
  if (local_78.vect != (Edge *)0x0) {
    operator_delete__(&local_78.vect[-1]._nodeD);
  }
  if (local_48.vect != (int *)0x0) {
    operator_delete__(local_48.vect);
  }
  if (local_58.vect != (int *)0x0) {
    operator_delete__(local_58.vect);
  }
  return __return_storage_ptr__;
}

Assistant:

Graph minSpanningTree(int node) {
        vector <int> father(_nodeCnt);
        vector <int> depth(_nodeCnt);

        for (int i = 0; i < _nodeCnt; ++i) {
            father[i] = i;
            depth[i] = 1;
        }

        int currCC = inCC[node];

        vector <Edge> ccEdges;
        for (int i = 0; i < edges.size(); ++i) {
            Edge currEdge = getEdge(i);
            int source = currEdge.getSource();
            int dest = currEdge.getDest();

            if (inCC[source] == currCC) { //destination cannot be outside CC (the two nodes are connected)
                ccEdges.push_back(currEdge);
            }
        }

        std::sort(ccEdges.begin(), ccEdges.end(), byCostCmp);

//        ccEdges.mergeSort(0, ccEdges.size() - 1, [](Edge a, Edge b) {
//            return a.getCost() < b.getCost();
//        });

        Graph MST(_nodeCnt);

        for (int i = 0; i < ccEdges.size(); ++i) {
            Edge currEdge = ccEdges[i];
            int source = currEdge.getSource();
            int dest = currEdge.getDest();

            if (findRt(father, source) != findRt(father, dest)) {
                mergeDSU(father, depth, source, dest);
                MST.addEdge(currEdge);
            }
        }

        return MST;
    }